

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O0

int yyText(GREG *G,int begin,int end)

{
  char *pcVar1;
  int local_1c;
  int yyleng;
  int end_local;
  int begin_local;
  GREG *G_local;
  
  local_1c = end - begin;
  if (local_1c < 1) {
    local_1c = 0;
  }
  else {
    while (G->textlen < local_1c + 1) {
      G->textlen = G->textlen << 1;
      pcVar1 = (char *)realloc(G->text,(long)G->textlen);
      G->text = pcVar1;
    }
    memcpy(G->text,G->buf + begin,(long)local_1c);
  }
  G->text[local_1c] = '\0';
  return local_1c;
}

Assistant:

YY_LOCAL(int) yyText(GREG *G, int begin, int end)
{
  int yyleng= end - begin;
  if (yyleng <= 0)
    yyleng= 0;
  else
    {
      while (G->textlen < (yyleng + 1))
        {
          G->textlen *= 2;
          G->text= (char*)YY_REALLOC(G->text, G->textlen, G->data);
        }
      memcpy(G->text, G->buf + begin, yyleng);
    }
  G->text[yyleng]= '\0';
  return yyleng;
}